

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
llvm::SmallVectorImpl<llvm::StringRef>::emplace_back<char_const*&>
          (SmallVectorImpl<llvm::StringRef> *this,char **Args)

{
  void *pvVar1;
  char *__s;
  size_t sVar2;
  uint uVar3;
  
  if ((this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity <=
      (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size) {
    emplace_back<char_const*&>(this);
  }
  pvVar1 = (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX;
  uVar3 = (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size;
  __s = *Args;
  *(char **)((long)pvVar1 + (ulong)uVar3 * 0x10) = __s;
  if (__s == (char *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = strlen(__s);
  }
  *(size_t *)((long)pvVar1 + (ulong)uVar3 * 0x10 + 8) = sVar2;
  if (uVar3 < (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
              super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity)
  {
    uVar3 = uVar3 + 1;
    (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
    super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = uVar3;
    if (uVar3 != 0) {
      return (reference)((long)pvVar1 + (ulong)uVar3 * 0x10 + -0x10);
    }
    __assert_fail("!empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                  ,0xa7,
                  "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::back() [T = llvm::StringRef]"
                 );
  }
  __assert_fail("N <= capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

reference emplace_back(ArgTypes &&... Args) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void *)this->end()) T(std::forward<ArgTypes>(Args)...);
    this->set_size(this->size() + 1);
    return this->back();
  }